

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O1

RealType __thiscall
OpenMD::GofROmega::evaluateAngle(GofROmega *this,StuntDouble *sd1,StuntDouble *sd2,StuntDouble *sd3)

{
  double *pdVar1;
  double dVar2;
  char cVar3;
  bool bVar4;
  uint i_5;
  double **ppdVar5;
  long lVar6;
  long lVar7;
  double **ppdVar8;
  double (*padVar9) [3];
  double tmp;
  double dVar10;
  Vector<double,_3U> result_2;
  Vector3d v2;
  Vector3d v1;
  Vector<double,_3U> result;
  MultipoleAdapter ma2;
  double local_118 [4];
  double local_f8 [4];
  Vector3d local_d8;
  double *local_b8;
  double dStack_b0;
  double local_a8 [7];
  MultipoleAdapter local_70;
  double local_68 [10];
  
  cVar3 = (((this->super_GofRAngle).super_RadialDistrFunc.super_StaticAnalyser.info_)->simParams_->
          UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  lVar7 = 0;
  local_d8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_d8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_d8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_f8[2] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  lVar6 = *(long *)((long)&(sd3->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + sd3->storage_);
  local_68[2] = *(double *)(lVar6 + 0x10 + (long)sd3->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar6 + (long)sd3->localIndex_ * 0x18);
  local_68[0] = *pdVar1;
  local_68[1] = pdVar1[1];
  lVar6 = *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + sd1->storage_);
  local_118[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)sd1->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar6 + (long)sd1->localIndex_ * 0x18);
  local_118[0] = *pdVar1;
  local_118[1] = pdVar1[1];
  local_b8 = (double *)0x0;
  dStack_b0 = 0.0;
  local_a8[0] = 0.0;
  do {
    (&local_b8)[lVar7] = (double *)(local_68[lVar7] - local_118[lVar7]);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_d8.super_Vector<double,_3U>.data_[2] = local_a8[0];
  local_d8.super_Vector<double,_3U>.data_[0] = (double)local_b8;
  local_d8.super_Vector<double,_3U>.data_[1] = dStack_b0;
  if (cVar3 != '\0') {
    Snapshot::wrapVector((this->super_GofRAngle).super_RadialDistrFunc.currentSnapshot_,&local_d8);
  }
  if (1 < sd2->objType_ - otDAtom) {
    (*sd2->_vptr_StuntDouble[7])(&local_b8,sd2);
    snprintf(painCave.errMsg,2000,"GofROmega: attempted to use a non-directional object: %s\n");
    if (local_b8 != local_a8) {
      operator_delete(local_b8,(long)local_a8[0] + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  if (sd2->objType_ < otRigidBody) {
    local_70.at_ = (AtomType *)sd2[1]._vptr_StuntDouble;
    bVar4 = MultipoleAdapter::isDipole(&local_70);
    if (bVar4) {
      lVar6 = *(long *)((long)&(sd2->snapshotMan_->currentSnapshot_->atomData).dipole.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sd2->storage_);
      local_f8[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)sd2->localIndex_ * 0x18);
      pdVar1 = (double *)(lVar6 + (long)sd2->localIndex_ * 0x18);
      local_f8[0] = *pdVar1;
      local_f8[1] = pdVar1[1];
      goto LAB_00139db5;
    }
    padVar9 = (double (*) [3])local_68;
    StuntDouble::getA((RotMat3x3d *)padVar9,sd2);
    ppdVar5 = &local_b8;
    local_a8[4] = 0.0;
    local_a8[5] = 0.0;
    local_a8[2] = 0.0;
    local_a8[3] = 0.0;
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_b8 = (double *)0x0;
    dStack_b0 = 0.0;
    local_a8[6] = 0.0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      ppdVar8 = ppdVar5;
      do {
        *ppdVar8 = (double *)
                   (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).data_
                   [0][lVar7];
        lVar7 = lVar7 + 1;
        ppdVar8 = ppdVar8 + 3;
      } while (lVar7 != 3);
      lVar6 = lVar6 + 1;
      ppdVar5 = ppdVar5 + 1;
      padVar9 = padVar9 + 1;
    } while (lVar6 != 3);
    local_118[0] = 0.0;
    local_118[1] = 0.0;
    local_118[2] = 0.0;
    ppdVar5 = &local_b8;
    lVar6 = 0;
    do {
      dVar10 = local_118[lVar6];
      lVar7 = 0;
      do {
        dVar10 = dVar10 + *(double *)((long)ppdVar5 + lVar7) *
                          *(double *)((long)&OpenMD::V3Z + lVar7);
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x18);
      local_118[lVar6] = dVar10;
      lVar6 = lVar6 + 1;
      ppdVar5 = ppdVar5 + 3;
    } while (lVar6 != 3);
  }
  else {
    padVar9 = (double (*) [3])local_68;
    StuntDouble::getA((RotMat3x3d *)padVar9,sd2);
    ppdVar5 = &local_b8;
    local_a8[4] = 0.0;
    local_a8[5] = 0.0;
    local_a8[2] = 0.0;
    local_a8[3] = 0.0;
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_b8 = (double *)0x0;
    dStack_b0 = 0.0;
    local_a8[6] = 0.0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      ppdVar8 = ppdVar5;
      do {
        *ppdVar8 = (double *)
                   (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).data_
                   [0][lVar7];
        lVar7 = lVar7 + 1;
        ppdVar8 = ppdVar8 + 3;
      } while (lVar7 != 3);
      lVar6 = lVar6 + 1;
      ppdVar5 = ppdVar5 + 1;
      padVar9 = padVar9 + 1;
    } while (lVar6 != 3);
    local_118[0] = 0.0;
    local_118[1] = 0.0;
    local_118[2] = 0.0;
    ppdVar5 = &local_b8;
    lVar6 = 0;
    do {
      dVar10 = local_118[lVar6];
      lVar7 = 0;
      do {
        dVar10 = dVar10 + *(double *)((long)ppdVar5 + lVar7) *
                          *(double *)((long)&OpenMD::V3Z + lVar7);
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x18);
      local_118[lVar6] = dVar10;
      lVar6 = lVar6 + 1;
      ppdVar5 = ppdVar5 + 3;
    } while (lVar6 != 3);
  }
  local_f8[2] = local_118[2];
  local_f8[0] = local_118[0];
  local_f8[1] = local_118[1];
LAB_00139db5:
  dVar10 = 0.0;
  lVar6 = 0;
  do {
    dVar2 = local_d8.super_Vector<double,_3U>.data_[lVar6];
    dVar10 = dVar10 + dVar2 * dVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  lVar6 = 0;
  do {
    local_d8.super_Vector<double,_3U>.data_[lVar6] =
         local_d8.super_Vector<double,_3U>.data_[lVar6] / dVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  dVar10 = 0.0;
  lVar6 = 0;
  do {
    dVar10 = dVar10 + local_f8[lVar6] * local_f8[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  lVar6 = 0;
  do {
    local_f8[lVar6] = local_f8[lVar6] / dVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  dVar10 = 0.0;
  lVar6 = 0;
  do {
    dVar10 = dVar10 + local_d8.super_Vector<double,_3U>.data_[lVar6] * local_f8[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  return dVar10;
}

Assistant:

RealType GofROmega::evaluateAngle(StuntDouble* sd1, StuntDouble* sd2,
                                    StuntDouble* sd3) {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d v1;
    Vector3d v2;

    v1 = sd3->getPos() - sd1->getPos();
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(v1);

    if (!sd2->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofROmega: attempted to use a non-directional object: %s\n",
               sd2->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    if (sd2->isAtom()) {
      AtomType* atype2     = static_cast<Atom*>(sd2)->getAtomType();
      MultipoleAdapter ma2 = MultipoleAdapter(atype2);

      if (ma2.isDipole())
        v2 = sd2->getDipole();
      else
        v2 = sd2->getA().transpose() * V3Z;
    } else {
      v2 = sd2->getA().transpose() * V3Z;
    }

    v1.normalize();
    v2.normalize();
    return dot(v1, v2);
  }